

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pbVar1;
  pointer *ppFVar2;
  uint uVar3;
  int iVar4;
  char cVar5;
  options_description_easy_init *poVar6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar7;
  const_iterator cVar8;
  ostream *poVar9;
  difference_type dVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  undefined1 local_290 [8];
  variables_map vm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_280 [8];
  _Rb_tree_node_base local_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220 [48];
  undefined1 *local_1f0;
  options_description desc;
  undefined1 local_1e0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_1c8 [24];
  void *local_1b0;
  undefined4 local_1a8;
  undefined8 local_1a0;
  undefined4 local_198;
  undefined8 local_190;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_188 [24];
  undefined1 local_170 [8];
  positional_options_description pdesc;
  undefined1 *local_158;
  undefined1 local_148 [16];
  undefined1 auStack_138 [8];
  Flic flic;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_108 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_e8 [32];
  options_description *local_c8;
  undefined1 local_b8 [8];
  string input;
  directory_iterator local_90;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_88;
  basic_parsed_options<char> local_80;
  directory_iterator local_58;
  undefined1 local_50 [8];
  string output;
  
  boost::program_options::options_description::options_description
            ((options_description *)&local_1f0,0x50,0x28);
  local_b8 = (undefined1  [8])&input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  local_50 = (undefined1  [8])&output._M_string_length;
  output._M_dataplus._M_p = (pointer)0x0;
  output._M_string_length._0_1_ = 0;
  auStack_138 = (undefined1  [8])
                boost::program_options::options_description::add_options
                          ((options_description *)&local_1f0);
  poVar6 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)auStack_138,"help","show program help");
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8)
  ;
  poVar6 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar6,"input,i",(value_semantic *)ptVar7,
                      "input path to either a Flic file to decompile or a directory of bitmaps to compile"
                     );
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50)
  ;
  local_290 = (undefined1  [8])local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"");
  ptVar7 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_290);
  boost::program_options::options_description_easy_init::operator()
            (poVar6,"output,o",(value_semantic *)ptVar7,
             "output path to either the compiled Flic file or a directory to put decompiled frames in"
            );
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)local_170);
  boost::program_options::positional_options_description::add
            ((positional_options_description *)local_170,"input",1);
  pcVar12 = "output";
  boost::program_options::positional_options_description::add
            ((positional_options_description *)local_170,"output",2);
  boost::program_options::variables_map::variables_map((variables_map *)local_290);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)auStack_138,argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((cmdline *)auStack_138,(options_description *)&local_1f0);
  local_c8 = (options_description *)&local_1f0;
  boost::program_options::detail::cmdline::set_positional_options
            ((cmdline *)auStack_138,(positional_options_description *)local_170);
  boost::program_options::basic_command_line_parser<char>::run
            (&local_80,(basic_command_line_parser<char> *)auStack_138);
  boost::program_options::store((basic_parsed_options *)&local_80,(variables_map *)local_290,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_80.options);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_e8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_138);
  boost::program_options::notify((variables_map *)local_290);
  ppFVar2 = &flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
             super__Vector_impl_data._M_finish;
  auStack_138 = (undefined1  [8])ppFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_138,"input","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_280,(key_type *)auStack_138);
  if (cVar8._M_node == &local_278) {
    bVar13 = true;
  }
  else {
    pbVar1 = (pointer)&local_80.options.
                       super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_80.options.
    super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"help","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_280,(key_type *)&local_80);
    bVar13 = cVar8._M_node != &local_278;
    if (local_80.options.
        super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar1) {
      operator_delete(local_80.options.
                      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (auStack_138 != (undefined1  [8])ppFVar2) {
    operator_delete((void *)auStack_138);
  }
  if (bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "FlicTool 1.1\nCopyright (c) 2014 Merigrim (https://github.com/Merigrim)\n\n",0x48);
    iVar11 = 1;
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)&local_1f0);
    goto LAB_00123154;
  }
  auStack_138 = (undefined1  [8])ppFVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_138,local_b8,input._M_dataplus._M_p + (long)local_b8);
  boost::filesystem::detail::status((detail *)&local_80,(path *)auStack_138,(error_code *)0x0);
  uVar3 = (uint)local_80.options.
                super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_138 != (undefined1  [8])ppFVar2) {
    operator_delete((void *)auStack_138);
  }
  if (uVar3 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Invalid input path specified: \"",0x26);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_b8,(long)input._M_dataplus._M_p);
    iVar11 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" does not exist.\n",0x12);
    goto LAB_00123154;
  }
  auStack_138 = (undefined1  [8])ppFVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_138,local_b8,input._M_dataplus._M_p + (long)local_b8);
  boost::filesystem::detail::status((detail *)&local_80,(path *)auStack_138,(error_code *)0x0);
  iVar11 = (uint)local_80.options.
                 super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_138 != (undefined1  [8])ppFVar2) {
    operator_delete((void *)auStack_138);
  }
  if (output._M_dataplus._M_p == (pointer)0x0) {
    if (iVar11 == 3) {
      pcVar12 = "output.flh";
    }
    std::__cxx11::string::_M_replace((ulong)local_50,0,(char *)0x0,(ulong)pcVar12);
  }
  auStack_138 = (undefined1  [8])ppFVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_138,local_50,output._M_dataplus._M_p + (long)local_50);
  boost::filesystem::detail::status((detail *)&local_80,(path *)auStack_138,(error_code *)0x0);
  uVar3 = (uint)local_80.options.
                super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_138 != (undefined1  [8])ppFVar2) {
    operator_delete((void *)auStack_138);
  }
  if (uVar3 < 2) {
    if (iVar11 == 3) goto LAB_00123111;
    auStack_138 = (undefined1  [8])ppFVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_138,local_50,output._M_dataplus._M_p + (long)local_50);
    cVar5 = boost::filesystem::detail::create_directories((path *)auStack_138,(error_code *)0x0);
    if (auStack_138 != (undefined1  [8])ppFVar2) {
      operator_delete((void *)auStack_138);
    }
    if (cVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: Unable to create output directory \"",0x2a);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_50,(long)output._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"\". Please make sure that your permissions are set up correctly.",0x3f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      iVar11 = 1;
      std::ostream::flush();
      goto LAB_00123154;
    }
LAB_0012312a:
    flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_138 = (undefined1  [8])0x0;
    Flic::decompile((Flic *)auStack_138,(string *)local_b8,(string *)local_50);
LAB_00123141:
    if (auStack_138 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_138);
    }
  }
  else {
    auStack_138 = (undefined1  [8])ppFVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_138,local_50,output._M_dataplus._M_p + (long)local_50);
    boost::filesystem::detail::status((detail *)&local_80,(path *)auStack_138,(error_code *)0x0);
    iVar4 = (uint)local_80.options.
                  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (auStack_138 != (undefined1  [8])ppFVar2) {
      operator_delete((void *)auStack_138);
    }
    if (iVar4 != 2) {
      auStack_138 = (undefined1  [8])ppFVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_138,local_50,output._M_dataplus._M_p + (long)local_50);
      boost::filesystem::detail::status((detail *)&local_80,(path *)auStack_138,(error_code *)0x0);
      iVar4 = (uint)local_80.options.
                    super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (auStack_138 != (undefined1  [8])ppFVar2) {
        operator_delete((void *)auStack_138);
      }
      if (iVar4 == 3) {
        pbVar1 = (pointer)&local_80.options.
                           super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_80.options.
        super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_50,output._M_dataplus._M_p + (long)local_50);
        boost::filesystem::directory_iterator::directory_iterator(&local_90,(path *)&local_80,none);
        local_88.px = (dir_itr_imp *)0x0;
        input.field_2._8_8_ = local_90.m_imp.px;
        if (local_90.m_imp.px != (dir_itr_imp *)0x0) {
          LOCK();
          *(int *)local_90.m_imp.px = *(int *)local_90.m_imp.px + 1;
          UNLOCK();
        }
        local_58.m_imp.px =
             (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
        auStack_138 = (undefined1  [8])boost::filesystem::is_regular_file;
        flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)boost::filesystem::directory_entry::path;
        flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dVar10 = std::
                 __count_if<boost::filesystem::directory_iterator,__gnu_cxx::__ops::_Iter_pred<std::_Bind<bool(*(std::_Bind<boost::filesystem::path_const&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()const>))(boost::filesystem::path_const&)>>>
                           ((directory_iterator *)((long)&input.field_2 + 8),&local_58,
                            (_Iter_pred<std::_Bind<bool_(*(std::_Bind<const_boost::filesystem::path_&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()_const>))(const_boost::filesystem::path_&)>_>
                             *)auStack_138);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  (&local_58.m_imp);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)
                   ((long)&input.field_2 + 8));
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  (&local_90.m_imp);
        if (local_80.options.
            super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
            ._M_impl.super__Vector_impl_data._M_start != pbVar1) {
          operator_delete(local_80.options.
                          super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (0 < (int)dVar10) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: Output directory \"",0x1b);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_50,(long)output._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     "\" isn\'t empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) "
                     ,0x5f);
          bVar13 = prompt();
          goto LAB_001230f2;
        }
      }
LAB_001230f6:
      if (iVar11 != 3) goto LAB_0012312a;
LAB_00123111:
      flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auStack_138 = (undefined1  [8])0x0;
      Flic::compile((Flic *)auStack_138,(string *)local_b8,(string *)local_50);
      goto LAB_00123141;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: Output file \"",0x16);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_50,(long)output._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\" already exists. Overwrite it? (Y to overwrite, default: no) ",0x3e);
    bVar13 = prompt();
LAB_001230f2:
    if (bVar13 != false) goto LAB_001230f6;
  }
  iVar11 = 0;
LAB_00123154:
  local_290 = (undefined1  [8])&PTR__variables_map_0018c0e8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_220);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_250);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_280);
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  if (local_50 != (undefined1  [8])&output._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (local_b8 != (undefined1  [8])&input._M_string_length) {
    operator_delete((void *)local_b8);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_188);
  if (local_1b0 != (void *)0x0) {
    operator_delete(local_1b0);
    local_1b0 = (void *)0x0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_198 = 0;
    local_190 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_1c8);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  return iVar11;
}

Assistant:

int main(int argc, char **argv) {
	po::options_description desc;
	std::string input, output;
	desc.add_options()
		("help", "show program help")
		("input,i", po::value<std::string>(&input), "input path to either a Flic file to decompile or a directory of bitmaps to compile")
		("output,o", po::value<std::string>(&output)->default_value(""), "output path to either the compiled Flic file or a directory to put decompiled frames in")
	;
	po::positional_options_description pdesc;
	pdesc.add("input", 1);
	pdesc.add("output", 2);

	po::variables_map vm;
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(pdesc).run(), vm);
	} catch (po::unknown_option &e) {
		showHelp(desc);
		return 1;
	}
	po::notify(vm);

	// If the user has forgotten to write any arguments or explicitly requested help
	if (!vm.count("input") || vm.count("help")) {
		showHelp(desc);
		return 1;
	}

	// Make sure the input path actually exists
	if (!fs::exists(input)) {
		std::cerr << "Error: Invalid input path specified: \"" << input << "\" does not exist.\n";
		return 1;
	}

	bool compiling = fs::is_directory(input);
	
	if (output.empty()) {
		// We need different default output filenames depending on the desired action
		if (compiling) {
			output = "output.flh";
		} else {
			output = "output";
		}
	}

	if (fs::exists(output)) {
		// We need to check if the user is about to accidentally overwrite already existing files
		if (fs::is_regular_file(output)) {
			std::cout << "Warning: Output file \"" << output << "\" already exists. Overwrite it? (Y to overwrite, default: no) ";
			if (!prompt()) {
				return 0;
			}
		} else if (fs::is_directory(output)) {
			// Check if there are any files in the output directory. Instead of looping through an
			// unknown number of files and checking file names, we just check if the folder isn't
			// empty, in which case we warn the user
			int count = std::count_if(fs::directory_iterator(output), fs::directory_iterator(),
						std::bind(static_cast<bool(*)(const fs::path&)>(fs::is_regular_file), 
						std::bind(&fs::directory_entry::path, std::placeholders::_1)));
			if (count > 0) {
				std::cout << "Warning: Output directory \"" << output << "\" isn't empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) ";
				if (!prompt()) {
					return 0;
				}
			}
		}
	} else if (!compiling) { // If we're decompiling but the output directory doesn't exist, we need to create it
		if (!fs::create_directories(output)) {
			std::cerr << "Error: Unable to create output directory \"" << output << "\". Please make sure that your permissions are set up correctly." << std::endl;
			return 1;
		}
	}

	Flic flic;
	if (compiling) {
		flic.compile(input, output);
	} else {
		flic.decompile(input, output);
	}

	return 0;
}